

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.hpp
# Opt level: O0

bool __thiscall inja::Parser::parse_statement(Parser *this,Template *tmpl,Kind closing,path *path)

{
  string *psVar1;
  BlockNode *pBVar2;
  basic_string_view<char,_std::char_traits<char>_> __x;
  basic_string_view<char,_std::char_traits<char>_> __x_00;
  basic_string_view<char,_std::char_traits<char>_> __x_01;
  basic_string_view<char,_std::char_traits<char>_> __x_02;
  basic_string_view<char,_std::char_traits<char>_> __x_03;
  basic_string_view<char,_std::char_traits<char>_> __x_04;
  basic_string_view<char,_std::char_traits<char>_> __x_05;
  basic_string_view<char,_std::char_traits<char>_> __x_06;
  basic_string_view<char,_std::char_traits<char>_> __x_07;
  basic_string_view<char,_std::char_traits<char>_> __x_08;
  basic_string_view<char,_std::char_traits<char>_> __x_09;
  basic_string_view<char,_std::char_traits<char>_> __x_10;
  basic_string_view<char,_std::char_traits<char>_> __x_11;
  bool bVar3;
  element_type *peVar4;
  reference ppIVar5;
  element_type *peVar6;
  long lVar7;
  element_type *peVar8;
  reference ppFVar9;
  const_pointer pvVar10;
  element_type *peVar11;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<inja::BlockStatementNode>_>_>,_bool>
  pVar12;
  string local_788;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_768;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_748;
  basic_string_view<char,_std::char_traits<char>_> local_728;
  size_t local_718;
  char *local_710;
  long local_708;
  undefined1 local_700 [8];
  shared_ptr<inja::SetStatementNode> set_statement_node;
  string local_6e8 [8];
  string key;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_688;
  basic_string_view<char,_std::char_traits<char>_> local_668;
  size_t local_658;
  char *local_650;
  long local_648;
  undefined1 local_640 [16];
  undefined1 local_630 [8];
  string template_name_1;
  undefined1 local_5e8 [16];
  undefined1 local_5d8 [8];
  string template_name;
  value_type *for_statement_data;
  string local_588;
  basic_string_view<char,_std::char_traits<char>_> local_568;
  size_t local_558;
  char *local_550;
  string local_548;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_528;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_508;
  basic_string_view<char,_std::char_traits<char>_> local_4e8;
  size_t local_4d8;
  char *local_4d0;
  element_type *local_4c8;
  long local_4c0;
  allocator<char> local_4b1;
  string local_4b0 [32];
  undefined1 local_490 [32];
  string local_470 [39];
  allocator<char> local_449;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_448;
  undefined1 local_428 [24];
  Token key_token;
  string local_3f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3b8;
  undefined1 local_398 [8];
  shared_ptr<inja::ForStatementNode> for_statement_node;
  Token value_token;
  string local_368;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_348;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_328;
  basic_string_view<char,_std::char_traits<char>_> local_308;
  size_t local_2f8;
  char *local_2f0;
  reference local_2e8;
  value_type *block_statement_data;
  string local_2d8;
  basic_string_view<char,_std::char_traits<char>_> local_2b8;
  size_t local_2a8;
  char *local_2a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_298;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_278;
  _Base_ptr local_258;
  undefined1 local_250;
  _Base_ptr local_248;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<inja::BlockStatementNode>_>_>,_bool>
  success;
  undefined1 local_228 [8];
  shared_ptr<inja::BlockStatementNode> block_statement_node;
  undefined1 local_210 [8];
  string block_name;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b0;
  basic_string_view<char,_std::char_traits<char>_> local_190;
  size_t local_180;
  char *local_178;
  reference local_170;
  value_type *if_statement_data_1;
  string local_160;
  basic_string_view<char,_std::char_traits<char>_> local_140;
  size_t local_130;
  char *local_128;
  element_type *local_120;
  long local_118;
  undefined1 local_109;
  undefined1 local_108 [8];
  shared_ptr<inja::IfStatementNode> if_statement_node_1;
  value_type *if_statement_data;
  string local_c8;
  basic_string_view<char,_std::char_traits<char>_> local_a8;
  size_t local_98;
  char *local_90;
  uint local_84;
  element_type *local_80 [3];
  long local_68;
  undefined1 local_60 [8];
  shared_ptr<inja::IfStatementNode> if_statement_node;
  path *path_local;
  Kind closing_local;
  Template *tmpl_local;
  Parser *this_local;
  
  if ((this->tok).kind != Id) {
    this_local._7_1_ = 0;
    goto LAB_0019a7cb;
  }
  __x_08._M_len = (this->tok).text._M_len;
  __x_08._M_str = (this->tok).text._M_str;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)
             &if_statement_node.
              super___shared_ptr<inja::IfStatementNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount,"if"
            );
  bVar3 = ::std::operator==(__x_08,stack0xffffffffffffffb0);
  if (bVar3) {
    get_next_token(this);
    pvVar10 = std::basic_string_view<char,_std::char_traits<char>_>::data(&(this->tok).text);
    local_68 = ::std::__cxx11::string::c_str();
    local_68 = (long)pvVar10 - local_68;
    ::std::make_shared<inja::IfStatementNode,inja::BlockNode*&,long>
              ((BlockNode **)local_60,(long *)&this->current_block);
    ::std::vector<std::shared_ptr<inja::AstNode>,std::allocator<std::shared_ptr<inja::AstNode>>>::
    emplace_back<std::shared_ptr<inja::IfStatementNode>&>
              ((vector<std::shared_ptr<inja::AstNode>,std::allocator<std::shared_ptr<inja::AstNode>>>
                *)&this->current_block->nodes,(shared_ptr<inja::IfStatementNode> *)local_60);
    local_80[0] = std::__shared_ptr<inja::IfStatementNode,_(__gnu_cxx::_Lock_policy)2>::get
                            ((__shared_ptr<inja::IfStatementNode,_(__gnu_cxx::_Lock_policy)2> *)
                             local_60);
    ::std::
    stack<inja::IfStatementNode*,std::deque<inja::IfStatementNode*,std::allocator<inja::IfStatementNode*>>>
    ::emplace<inja::IfStatementNode*>
              ((stack<inja::IfStatementNode*,std::deque<inja::IfStatementNode*,std::allocator<inja::IfStatementNode*>>>
                *)&this->if_statement_stack,local_80);
    peVar4 = std::
             __shared_ptr_access<inja::IfStatementNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<inja::IfStatementNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_60);
    this->current_block = &peVar4->true_statement;
    peVar4 = std::
             __shared_ptr_access<inja::IfStatementNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<inja::IfStatementNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_60);
    this->current_expression_list = &peVar4->condition;
    bVar3 = parse_expression(this,tmpl,closing);
    if (!bVar3) {
      this_local._7_1_ = 0;
    }
    local_84 = (uint)!bVar3;
    std::shared_ptr<inja::IfStatementNode>::~shared_ptr
              ((shared_ptr<inja::IfStatementNode> *)local_60);
joined_r0x00198cb7:
    if (local_84 != 0) goto LAB_0019a7cb;
  }
  else {
    local_98 = (this->tok).text._M_len;
    local_90 = (this->tok).text._M_str;
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_a8,"else");
    __x_07._M_str = local_90;
    __x_07._M_len = local_98;
    bVar3 = ::std::operator==(__x_07,local_a8);
    if (bVar3) {
      bVar3 = std::
              stack<inja::IfStatementNode_*,_std::deque<inja::IfStatementNode_*,_std::allocator<inja::IfStatementNode_*>_>_>
              ::empty(&this->if_statement_stack);
      if (bVar3) {
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_c8,"else without matching if",
                   (allocator<char> *)((long)&if_statement_data + 7));
        throw_parser_error(this,&local_c8);
        ::std::__cxx11::string::~string((string *)&local_c8);
        ::std::allocator<char>::~allocator((allocator<char> *)((long)&if_statement_data + 7));
      }
      ppIVar5 = std::
                stack<inja::IfStatementNode_*,_std::deque<inja::IfStatementNode_*,_std::allocator<inja::IfStatementNode_*>_>_>
                ::top(&this->if_statement_stack);
      get_next_token(this);
      (*ppIVar5)->has_false_statement = true;
      this->current_block = &(*ppIVar5)->false_statement;
      if ((this->tok).kind == Id) {
        __x_09._M_len = (this->tok).text._M_len;
        __x_09._M_str = (this->tok).text._M_str;
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  ((basic_string_view<char,_std::char_traits<char>_> *)
                   &if_statement_node_1.
                    super___shared_ptr<inja::IfStatementNode,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount,"if");
        bVar3 = ::std::operator==(__x_09,stack0xffffffffffffff08);
        if (bVar3) {
          get_next_token(this);
          local_109 = 1;
          pvVar10 = std::basic_string_view<char,_std::char_traits<char>_>::data(&(this->tok).text);
          local_118 = ::std::__cxx11::string::c_str();
          local_118 = (long)pvVar10 - local_118;
          ::std::make_shared<inja::IfStatementNode,bool,inja::BlockNode*&,long>
                    ((bool *)local_108,(BlockNode **)&local_109,(long *)&this->current_block);
          ::std::
          vector<std::shared_ptr<inja::AstNode>,std::allocator<std::shared_ptr<inja::AstNode>>>::
          emplace_back<std::shared_ptr<inja::IfStatementNode>&>
                    ((vector<std::shared_ptr<inja::AstNode>,std::allocator<std::shared_ptr<inja::AstNode>>>
                      *)&this->current_block->nodes,(shared_ptr<inja::IfStatementNode> *)local_108);
          local_120 = std::__shared_ptr<inja::IfStatementNode,_(__gnu_cxx::_Lock_policy)2>::get
                                ((__shared_ptr<inja::IfStatementNode,_(__gnu_cxx::_Lock_policy)2> *)
                                 local_108);
          ::std::
          stack<inja::IfStatementNode*,std::deque<inja::IfStatementNode*,std::allocator<inja::IfStatementNode*>>>
          ::emplace<inja::IfStatementNode*>
                    ((stack<inja::IfStatementNode*,std::deque<inja::IfStatementNode*,std::allocator<inja::IfStatementNode*>>>
                      *)&this->if_statement_stack,&local_120);
          peVar4 = std::
                   __shared_ptr_access<inja::IfStatementNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<inja::IfStatementNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)local_108);
          this->current_block = &peVar4->true_statement;
          peVar4 = std::
                   __shared_ptr_access<inja::IfStatementNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<inja::IfStatementNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)local_108);
          this->current_expression_list = &peVar4->condition;
          bVar3 = parse_expression(this,tmpl,closing);
          if (!bVar3) {
            this_local._7_1_ = 0;
          }
          local_84 = (uint)!bVar3;
          std::shared_ptr<inja::IfStatementNode>::~shared_ptr
                    ((shared_ptr<inja::IfStatementNode> *)local_108);
          goto joined_r0x00198cb7;
        }
      }
    }
    else {
      local_130 = (this->tok).text._M_len;
      local_128 = (this->tok).text._M_str;
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_140,"endif");
      __x_06._M_str = local_128;
      __x_06._M_len = local_130;
      bVar3 = ::std::operator==(__x_06,local_140);
      if (bVar3) {
        bVar3 = std::
                stack<inja::IfStatementNode_*,_std::deque<inja::IfStatementNode_*,_std::allocator<inja::IfStatementNode_*>_>_>
                ::empty(&this->if_statement_stack);
        if (bVar3) {
          ::std::allocator<char>::allocator();
          ::std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_160,"endif without matching if",
                     (allocator<char> *)((long)&if_statement_data_1 + 7));
          throw_parser_error(this,&local_160);
          ::std::__cxx11::string::~string((string *)&local_160);
          ::std::allocator<char>::~allocator((allocator<char> *)((long)&if_statement_data_1 + 7));
        }
        while (ppIVar5 = std::
                         stack<inja::IfStatementNode_*,_std::deque<inja::IfStatementNode_*,_std::allocator<inja::IfStatementNode_*>_>_>
                         ::top(&this->if_statement_stack), ((*ppIVar5)->is_nested & 1U) != 0) {
          std::
          stack<inja::IfStatementNode_*,_std::deque<inja::IfStatementNode_*,_std::allocator<inja::IfStatementNode_*>_>_>
          ::pop(&this->if_statement_stack);
        }
        local_170 = std::
                    stack<inja::IfStatementNode_*,_std::deque<inja::IfStatementNode_*,_std::allocator<inja::IfStatementNode_*>_>_>
                    ::top(&this->if_statement_stack);
        get_next_token(this);
        this->current_block = (*local_170)->parent;
        std::
        stack<inja::IfStatementNode_*,_std::deque<inja::IfStatementNode_*,_std::allocator<inja::IfStatementNode_*>_>_>
        ::pop(&this->if_statement_stack);
      }
      else {
        local_180 = (this->tok).text._M_len;
        local_178 = (this->tok).text._M_str;
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_190,"block")
        ;
        __x_05._M_str = local_178;
        __x_05._M_len = local_180;
        bVar3 = ::std::operator==(__x_05,local_190);
        if (bVar3) {
          get_next_token(this);
          if ((this->tok).kind != Id) {
            psVar1 = (string *)((long)&block_name.field_2 + 8);
            Token::describe_abi_cxx11_(psVar1,&this->tok);
            ::std::operator+(&local_1d0,"expected block name, got \'",psVar1);
            ::std::operator+(&local_1b0,&local_1d0,"\'");
            throw_parser_error(this,&local_1b0);
            ::std::__cxx11::string::~string((string *)&local_1b0);
            ::std::__cxx11::string::~string((string *)&local_1d0);
            ::std::__cxx11::string::~string((string *)(block_name.field_2._M_local_buf + 8));
          }
          ::std::allocator<char>::allocator();
          ::std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
                    ((string *)local_210,&(this->tok).text,
                     (allocator<char> *)
                     ((long)&block_statement_node.
                             super___shared_ptr<inja::BlockStatementNode,_(__gnu_cxx::_Lock_policy)2>
                             ._M_refcount._M_pi + 7));
          ::std::allocator<char>::~allocator
                    ((allocator<char> *)
                     ((long)&block_statement_node.
                             super___shared_ptr<inja::BlockStatementNode,_(__gnu_cxx::_Lock_policy)2>
                             ._M_refcount._M_pi + 7));
          std::basic_string_view<char,_std::char_traits<char>_>::data(&(this->tok).text);
          ::std::__cxx11::string::c_str();
          ::std::
          make_shared<inja::BlockStatementNode,inja::BlockNode*&,std::__cxx11::string_const&,long>
                    ((BlockNode **)local_228,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &this->current_block,(long *)local_210);
          ::std::
          vector<std::shared_ptr<inja::AstNode>,std::allocator<std::shared_ptr<inja::AstNode>>>::
          emplace_back<std::shared_ptr<inja::BlockStatementNode>&>
                    ((vector<std::shared_ptr<inja::AstNode>,std::allocator<std::shared_ptr<inja::AstNode>>>
                      *)&this->current_block->nodes,
                     (shared_ptr<inja::BlockStatementNode> *)local_228);
          success._8_8_ =
               std::__shared_ptr<inja::BlockStatementNode,_(__gnu_cxx::_Lock_policy)2>::get
                         ((__shared_ptr<inja::BlockStatementNode,_(__gnu_cxx::_Lock_policy)2> *)
                          local_228);
          ::std::
          stack<inja::BlockStatementNode*,std::deque<inja::BlockStatementNode*,std::allocator<inja::BlockStatementNode*>>>
          ::emplace<inja::BlockStatementNode*>
                    ((stack<inja::BlockStatementNode*,std::deque<inja::BlockStatementNode*,std::allocator<inja::BlockStatementNode*>>>
                      *)&this->block_statement_stack,(BlockStatementNode **)&success.second);
          peVar6 = std::
                   __shared_ptr_access<inja::BlockStatementNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<inja::BlockStatementNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)local_228);
          this->current_block = &peVar6->block;
          pVar12 = ::std::
                   map<std::__cxx11::string,std::shared_ptr<inja::BlockStatementNode>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<inja::BlockStatementNode>>>>
                   ::emplace<std::__cxx11::string_const&,std::shared_ptr<inja::BlockStatementNode>&>
                             ((map<std::__cxx11::string,std::shared_ptr<inja::BlockStatementNode>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<inja::BlockStatementNode>>>>
                               *)&tmpl->block_storage,
                              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_210,(shared_ptr<inja::BlockStatementNode> *)local_228);
          local_258 = (_Base_ptr)pVar12.first._M_node;
          local_250 = pVar12.second;
          local_248 = local_258;
          success.first._M_node._0_1_ = local_250;
          if (((undefined1  [16])pVar12 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
            ::std::operator+(&local_298,"block with the name \'",
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_210);
            ::std::operator+(&local_278,&local_298,"\' does already exist");
            throw_parser_error(this,&local_278);
            ::std::__cxx11::string::~string((string *)&local_278);
            ::std::__cxx11::string::~string((string *)&local_298);
          }
          get_next_token(this);
          std::shared_ptr<inja::BlockStatementNode>::~shared_ptr
                    ((shared_ptr<inja::BlockStatementNode> *)local_228);
          ::std::__cxx11::string::~string((string *)local_210);
        }
        else {
          local_2a8 = (this->tok).text._M_len;
          local_2a0 = (this->tok).text._M_str;
          std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                    (&local_2b8,"endblock");
          __x_04._M_str = local_2a0;
          __x_04._M_len = local_2a8;
          bVar3 = ::std::operator==(__x_04,local_2b8);
          if (bVar3) {
            bVar3 = std::
                    stack<inja::BlockStatementNode_*,_std::deque<inja::BlockStatementNode_*,_std::allocator<inja::BlockStatementNode_*>_>_>
                    ::empty(&this->block_statement_stack);
            if (bVar3) {
              ::std::allocator<char>::allocator();
              ::std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_2d8,"endblock without matching block",
                         (allocator<char> *)((long)&block_statement_data + 7));
              throw_parser_error(this,&local_2d8);
              ::std::__cxx11::string::~string((string *)&local_2d8);
              ::std::allocator<char>::~allocator
                        ((allocator<char> *)((long)&block_statement_data + 7));
            }
            local_2e8 = std::
                        stack<inja::BlockStatementNode_*,_std::deque<inja::BlockStatementNode_*,_std::allocator<inja::BlockStatementNode_*>_>_>
                        ::top(&this->block_statement_stack);
            get_next_token(this);
            this->current_block = (*local_2e8)->parent;
            std::
            stack<inja::BlockStatementNode_*,_std::deque<inja::BlockStatementNode_*,_std::allocator<inja::BlockStatementNode_*>_>_>
            ::pop(&this->block_statement_stack);
          }
          else {
            local_2f8 = (this->tok).text._M_len;
            local_2f0 = (this->tok).text._M_str;
            std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                      (&local_308,"for");
            __x_03._M_str = local_2f0;
            __x_03._M_len = local_2f8;
            bVar3 = ::std::operator==(__x_03,local_308);
            if (bVar3) {
              get_next_token(this);
              if ((this->tok).kind != Id) {
                Token::describe_abi_cxx11_(&local_368,&this->tok);
                ::std::operator+(&local_348,"expected id, got \'",&local_368);
                ::std::operator+(&local_328,&local_348,"\'");
                throw_parser_error(this,&local_328);
                ::std::__cxx11::string::~string((string *)&local_328);
                ::std::__cxx11::string::~string((string *)&local_348);
                ::std::__cxx11::string::~string((string *)&local_368);
              }
              for_statement_node.
              super___shared_ptr<inja::ForStatementNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)&this->tok;
              value_token._0_8_ = (this->tok).text._M_len;
              value_token.text._M_len = (size_t)(this->tok).text._M_str;
              get_next_token(this);
              std::shared_ptr<inja::ForStatementNode>::shared_ptr
                        ((shared_ptr<inja::ForStatementNode> *)local_398);
              if ((this->tok).kind == Comma) {
                get_next_token(this);
                if ((this->tok).kind != Id) {
                  Token::describe_abi_cxx11_(&local_3f8,&this->tok);
                  ::std::operator+(&local_3d8,"expected id, got \'",&local_3f8);
                  ::std::operator+(&local_3b8,&local_3d8,"\'");
                  throw_parser_error(this,&local_3b8);
                  ::std::__cxx11::string::~string((string *)&local_3b8);
                  ::std::__cxx11::string::~string((string *)&local_3d8);
                  ::std::__cxx11::string::~string((string *)&local_3f8);
                }
                key_token.text._M_len = value_token.text._M_len;
                local_428._16_8_ =
                     for_statement_node.
                     super___shared_ptr<inja::ForStatementNode,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi;
                key_token.kind = value_token.kind;
                key_token._4_4_ = value_token._4_4_;
                value_token.text._M_len = (size_t)(this->tok).text._M_str;
                for_statement_node.
                super___shared_ptr<inja::ForStatementNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                _M_pi = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)&this->tok;
                value_token._0_8_ = (this->tok).text._M_len;
                get_next_token(this);
                ::std::allocator<char>::allocator();
                ::std::__cxx11::string::
                string<std::basic_string_view<char,std::char_traits<char>>,void>
                          ((string *)&local_448,
                           (basic_string_view<char,_std::char_traits<char>_> *)&key_token,&local_449
                          );
                ::std::allocator<char>::allocator();
                ::std::__cxx11::string::
                string<std::basic_string_view<char,std::char_traits<char>>,void>
                          (local_470,
                           (basic_string_view<char,_std::char_traits<char>_> *)&value_token,
                           (allocator<char> *)(local_490 + 0x1f));
                pvVar10 = std::basic_string_view<char,_std::char_traits<char>_>::data
                                    (&(this->tok).text);
                lVar7 = ::std::__cxx11::string::c_str();
                local_490._16_8_ = (long)pvVar10 - lVar7;
                ::std::
                make_shared<inja::ForObjectStatementNode,std::__cxx11::string,std::__cxx11::string,inja::BlockNode*&,long>
                          ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_428,&local_448,(BlockNode **)local_470,(long *)&this->current_block
                          );
                ::std::shared_ptr<inja::ForStatementNode>::operator=
                          ((shared_ptr<inja::ForStatementNode> *)local_398,
                           (shared_ptr<inja::ForObjectStatementNode> *)local_428);
                std::shared_ptr<inja::ForObjectStatementNode>::~shared_ptr
                          ((shared_ptr<inja::ForObjectStatementNode> *)local_428);
                ::std::__cxx11::string::~string(local_470);
                ::std::allocator<char>::~allocator((allocator<char> *)(local_490 + 0x1f));
                ::std::__cxx11::string::~string((string *)&local_448);
                ::std::allocator<char>::~allocator(&local_449);
              }
              else {
                ::std::allocator<char>::allocator();
                ::std::__cxx11::string::
                string<std::basic_string_view<char,std::char_traits<char>>,void>
                          (local_4b0,
                           (basic_string_view<char,_std::char_traits<char>_> *)&value_token,
                           &local_4b1);
                pvVar10 = std::basic_string_view<char,_std::char_traits<char>_>::data
                                    (&(this->tok).text);
                local_4c0 = ::std::__cxx11::string::c_str();
                local_4c0 = (long)pvVar10 - local_4c0;
                ::std::
                make_shared<inja::ForArrayStatementNode,std::__cxx11::string,inja::BlockNode*&,long>
                          ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_490,(BlockNode **)local_4b0,(long *)&this->current_block);
                ::std::shared_ptr<inja::ForStatementNode>::operator=
                          ((shared_ptr<inja::ForStatementNode> *)local_398,
                           (shared_ptr<inja::ForArrayStatementNode> *)local_490);
                std::shared_ptr<inja::ForArrayStatementNode>::~shared_ptr
                          ((shared_ptr<inja::ForArrayStatementNode> *)local_490);
                ::std::__cxx11::string::~string(local_4b0);
                ::std::allocator<char>::~allocator(&local_4b1);
              }
              ::std::
              vector<std::shared_ptr<inja::AstNode>,std::allocator<std::shared_ptr<inja::AstNode>>>
              ::emplace_back<std::shared_ptr<inja::ForStatementNode>&>
                        ((vector<std::shared_ptr<inja::AstNode>,std::allocator<std::shared_ptr<inja::AstNode>>>
                          *)&this->current_block->nodes,
                         (shared_ptr<inja::ForStatementNode> *)local_398);
              local_4c8 = std::__shared_ptr<inja::ForStatementNode,_(__gnu_cxx::_Lock_policy)2>::get
                                    ((__shared_ptr<inja::ForStatementNode,_(__gnu_cxx::_Lock_policy)2>
                                      *)local_398);
              ::std::
              stack<inja::ForStatementNode*,std::deque<inja::ForStatementNode*,std::allocator<inja::ForStatementNode*>>>
              ::emplace<inja::ForStatementNode*>
                        ((stack<inja::ForStatementNode*,std::deque<inja::ForStatementNode*,std::allocator<inja::ForStatementNode*>>>
                          *)&this->for_statement_stack,&local_4c8);
              peVar8 = std::
                       __shared_ptr_access<inja::ForStatementNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       ::operator->((__shared_ptr_access<inja::ForStatementNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                     *)local_398);
              this->current_block = &peVar8->body;
              peVar8 = std::
                       __shared_ptr_access<inja::ForStatementNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       ::operator->((__shared_ptr_access<inja::ForStatementNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                     *)local_398);
              this->current_expression_list = &peVar8->condition;
              if ((this->tok).kind == Id) {
                local_4d8 = (this->tok).text._M_len;
                local_4d0 = (this->tok).text._M_str;
                std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                          (&local_4e8,"in");
                __x_02._M_str = local_4d0;
                __x_02._M_len = local_4d8;
                bVar3 = ::std::operator!=(__x_02,local_4e8);
                if (bVar3) goto LAB_00199dd2;
              }
              else {
LAB_00199dd2:
                Token::describe_abi_cxx11_(&local_548,&this->tok);
                ::std::operator+(&local_528,"expected \'in\', got \'",&local_548);
                ::std::operator+(&local_508,&local_528,"\'");
                throw_parser_error(this,&local_508);
                ::std::__cxx11::string::~string((string *)&local_508);
                ::std::__cxx11::string::~string((string *)&local_528);
                ::std::__cxx11::string::~string((string *)&local_548);
              }
              get_next_token(this);
              bVar3 = parse_expression(this,tmpl,closing);
              if (!bVar3) {
                this_local._7_1_ = 0;
              }
              local_84 = (uint)!bVar3;
              std::shared_ptr<inja::ForStatementNode>::~shared_ptr
                        ((shared_ptr<inja::ForStatementNode> *)local_398);
              goto joined_r0x00198cb7;
            }
            local_558 = (this->tok).text._M_len;
            local_550 = (this->tok).text._M_str;
            std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                      (&local_568,"endfor");
            __x_01._M_str = local_550;
            __x_01._M_len = local_558;
            bVar3 = ::std::operator==(__x_01,local_568);
            if (bVar3) {
              bVar3 = std::
                      stack<inja::ForStatementNode_*,_std::deque<inja::ForStatementNode_*,_std::allocator<inja::ForStatementNode_*>_>_>
                      ::empty(&this->for_statement_stack);
              if (bVar3) {
                ::std::allocator<char>::allocator();
                ::std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_588,"endfor without matching for",
                           (allocator<char> *)((long)&for_statement_data + 7));
                throw_parser_error(this,&local_588);
                ::std::__cxx11::string::~string((string *)&local_588);
                ::std::allocator<char>::~allocator
                          ((allocator<char> *)((long)&for_statement_data + 7));
              }
              ppFVar9 = std::
                        stack<inja::ForStatementNode_*,_std::deque<inja::ForStatementNode_*,_std::allocator<inja::ForStatementNode_*>_>_>
                        ::top(&this->for_statement_stack);
              get_next_token(this);
              this->current_block = (*ppFVar9)->parent;
              std::
              stack<inja::ForStatementNode_*,_std::deque<inja::ForStatementNode_*,_std::allocator<inja::ForStatementNode_*>_>_>
              ::pop(&this->for_statement_stack);
            }
            else {
              __x_10._M_len = (this->tok).text._M_len;
              __x_10._M_str = (this->tok).text._M_str;
              std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                        ((basic_string_view<char,_std::char_traits<char>_> *)
                         ((long)&template_name.field_2 + 8),"include");
              bVar3 = ::std::operator==(__x_10,stack0xfffffffffffffa48);
              if (bVar3) {
                get_next_token(this);
                parse_filename_abi_cxx11_((string *)local_5d8,this);
                add_to_template_storage(this,path,(string *)local_5d8);
                pBVar2 = this->current_block;
                std::basic_string_view<char,_std::char_traits<char>_>::data(&(this->tok).text);
                ::std::__cxx11::string::c_str();
                ::std::make_shared<inja::IncludeStatementNode,std::__cxx11::string&,long>
                          ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_5e8,(long *)local_5d8);
                ::std::
                vector<std::shared_ptr<inja::AstNode>,std::allocator<std::shared_ptr<inja::AstNode>>>
                ::emplace_back<std::shared_ptr<inja::IncludeStatementNode>>
                          ((vector<std::shared_ptr<inja::AstNode>,std::allocator<std::shared_ptr<inja::AstNode>>>
                            *)&pBVar2->nodes,(shared_ptr<inja::IncludeStatementNode> *)local_5e8);
                std::shared_ptr<inja::IncludeStatementNode>::~shared_ptr
                          ((shared_ptr<inja::IncludeStatementNode> *)local_5e8);
                get_next_token(this);
                ::std::__cxx11::string::~string((string *)local_5d8);
              }
              else {
                __x_11._M_len = (this->tok).text._M_len;
                __x_11._M_str = (this->tok).text._M_str;
                std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                          ((basic_string_view<char,_std::char_traits<char>_> *)
                           ((long)&template_name_1.field_2 + 8),"extends");
                bVar3 = ::std::operator==(__x_11,stack0xfffffffffffff9f0);
                if (!bVar3) {
                  local_658 = (this->tok).text._M_len;
                  local_650 = (this->tok).text._M_str;
                  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                            (&local_668,"set");
                  __x_00._M_str = local_650;
                  __x_00._M_len = local_658;
                  bVar3 = ::std::operator==(__x_00,local_668);
                  if (!bVar3) {
                    this_local._7_1_ = 0;
                    goto LAB_0019a7cb;
                  }
                  get_next_token(this);
                  if ((this->tok).kind != Id) {
                    psVar1 = (string *)((long)&key.field_2 + 8);
                    Token::describe_abi_cxx11_(psVar1,&this->tok);
                    ::std::operator+(&local_6a8,"expected variable name, got \'",psVar1);
                    ::std::operator+(&local_688,&local_6a8,"\'");
                    throw_parser_error(this,&local_688);
                    ::std::__cxx11::string::~string((string *)&local_688);
                    ::std::__cxx11::string::~string((string *)&local_6a8);
                    ::std::__cxx11::string::~string((string *)(key.field_2._M_local_buf + 8));
                  }
                  ::std::allocator<char>::allocator();
                  ::std::__cxx11::string::
                  string<std::basic_string_view<char,std::char_traits<char>>,void>
                            (local_6e8,&(this->tok).text,
                             (allocator<char> *)
                             ((long)&set_statement_node.
                                     super___shared_ptr<inja::SetStatementNode,_(__gnu_cxx::_Lock_policy)2>
                                     ._M_refcount._M_pi + 7));
                  ::std::allocator<char>::~allocator
                            ((allocator<char> *)
                             ((long)&set_statement_node.
                                     super___shared_ptr<inja::SetStatementNode,_(__gnu_cxx::_Lock_policy)2>
                                     ._M_refcount._M_pi + 7));
                  get_next_token(this);
                  pvVar10 = std::basic_string_view<char,_std::char_traits<char>_>::data
                                      (&(this->tok).text);
                  local_708 = ::std::__cxx11::string::c_str();
                  local_708 = (long)pvVar10 - local_708;
                  ::std::make_shared<inja::SetStatementNode,std::__cxx11::string_const&,long>
                            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_700,(long *)local_6e8);
                  ::std::
                  vector<std::shared_ptr<inja::AstNode>,std::allocator<std::shared_ptr<inja::AstNode>>>
                  ::emplace_back<std::shared_ptr<inja::SetStatementNode>&>
                            ((vector<std::shared_ptr<inja::AstNode>,std::allocator<std::shared_ptr<inja::AstNode>>>
                              *)&this->current_block->nodes,
                             (shared_ptr<inja::SetStatementNode> *)local_700);
                  peVar11 = std::
                            __shared_ptr_access<inja::SetStatementNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            ::operator->((__shared_ptr_access<inja::SetStatementNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                          *)local_700);
                  this->current_expression_list = &peVar11->expression;
                  local_718 = (this->tok).text._M_len;
                  local_710 = (this->tok).text._M_str;
                  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                            (&local_728,"=");
                  __x._M_str = local_710;
                  __x._M_len = local_718;
                  bVar3 = ::std::operator!=(__x,local_728);
                  if (bVar3) {
                    Token::describe_abi_cxx11_(&local_788,&this->tok);
                    ::std::operator+(&local_768,"expected \'=\', got \'",&local_788);
                    ::std::operator+(&local_748,&local_768,"\'");
                    throw_parser_error(this,&local_748);
                    ::std::__cxx11::string::~string((string *)&local_748);
                    ::std::__cxx11::string::~string((string *)&local_768);
                    ::std::__cxx11::string::~string((string *)&local_788);
                  }
                  get_next_token(this);
                  bVar3 = parse_expression(this,tmpl,closing);
                  if (!bVar3) {
                    this_local._7_1_ = 0;
                  }
                  local_84 = (uint)!bVar3;
                  std::shared_ptr<inja::SetStatementNode>::~shared_ptr
                            ((shared_ptr<inja::SetStatementNode> *)local_700);
                  ::std::__cxx11::string::~string(local_6e8);
                  goto joined_r0x00198cb7;
                }
                get_next_token(this);
                parse_filename_abi_cxx11_((string *)local_630,this);
                add_to_template_storage(this,path,(string *)local_630);
                pBVar2 = this->current_block;
                pvVar10 = std::basic_string_view<char,_std::char_traits<char>_>::data
                                    (&(this->tok).text);
                local_648 = ::std::__cxx11::string::c_str();
                local_648 = (long)pvVar10 - local_648;
                ::std::make_shared<inja::ExtendsStatementNode,std::__cxx11::string&,long>
                          ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_640,(long *)local_630);
                ::std::
                vector<std::shared_ptr<inja::AstNode>,std::allocator<std::shared_ptr<inja::AstNode>>>
                ::emplace_back<std::shared_ptr<inja::ExtendsStatementNode>>
                          ((vector<std::shared_ptr<inja::AstNode>,std::allocator<std::shared_ptr<inja::AstNode>>>
                            *)&pBVar2->nodes,(shared_ptr<inja::ExtendsStatementNode> *)local_640);
                std::shared_ptr<inja::ExtendsStatementNode>::~shared_ptr
                          ((shared_ptr<inja::ExtendsStatementNode> *)local_640);
                get_next_token(this);
                ::std::__cxx11::string::~string((string *)local_630);
              }
            }
          }
        }
      }
    }
  }
  this_local._7_1_ = 1;
LAB_0019a7cb:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool parse_statement(Template& tmpl, Token::Kind closing, const std::filesystem::path& path) {
    if (tok.kind != Token::Kind::Id) {
      return false;
    }

    if (tok.text == static_cast<decltype(tok.text)>("if")) {
      get_next_token();

      auto if_statement_node = std::make_shared<IfStatementNode>(current_block, tok.text.data() - tmpl.content.c_str());
      current_block->nodes.emplace_back(if_statement_node);
      if_statement_stack.emplace(if_statement_node.get());
      current_block = &if_statement_node->true_statement;
      current_expression_list = &if_statement_node->condition;

      if (!parse_expression(tmpl, closing)) {
        return false;
      }
    } else if (tok.text == static_cast<decltype(tok.text)>("else")) {
      if (if_statement_stack.empty()) {
        throw_parser_error("else without matching if");
      }
      auto& if_statement_data = if_statement_stack.top();
      get_next_token();

      if_statement_data->has_false_statement = true;
      current_block = &if_statement_data->false_statement;

      // Chained else if
      if (tok.kind == Token::Kind::Id && tok.text == static_cast<decltype(tok.text)>("if")) {
        get_next_token();

        auto if_statement_node = std::make_shared<IfStatementNode>(true, current_block, tok.text.data() - tmpl.content.c_str());
        current_block->nodes.emplace_back(if_statement_node);
        if_statement_stack.emplace(if_statement_node.get());
        current_block = &if_statement_node->true_statement;
        current_expression_list = &if_statement_node->condition;

        if (!parse_expression(tmpl, closing)) {
          return false;
        }
      }
    } else if (tok.text == static_cast<decltype(tok.text)>("endif")) {
      if (if_statement_stack.empty()) {
        throw_parser_error("endif without matching if");
      }

      // Nested if statements
      while (if_statement_stack.top()->is_nested) {
        if_statement_stack.pop();
      }

      auto& if_statement_data = if_statement_stack.top();
      get_next_token();

      current_block = if_statement_data->parent;
      if_statement_stack.pop();
    } else if (tok.text == static_cast<decltype(tok.text)>("block")) {
      get_next_token();

      if (tok.kind != Token::Kind::Id) {
        throw_parser_error("expected block name, got '" + tok.describe() + "'");
      }

      const std::string block_name = static_cast<std::string>(tok.text);

      auto block_statement_node = std::make_shared<BlockStatementNode>(current_block, block_name, tok.text.data() - tmpl.content.c_str());
      current_block->nodes.emplace_back(block_statement_node);
      block_statement_stack.emplace(block_statement_node.get());
      current_block = &block_statement_node->block;
      auto success = tmpl.block_storage.emplace(block_name, block_statement_node);
      if (!success.second) {
        throw_parser_error("block with the name '" + block_name + "' does already exist");
      }

      get_next_token();
    } else if (tok.text == static_cast<decltype(tok.text)>("endblock")) {
      if (block_statement_stack.empty()) {
        throw_parser_error("endblock without matching block");
      }

      auto& block_statement_data = block_statement_stack.top();
      get_next_token();

      current_block = block_statement_data->parent;
      block_statement_stack.pop();
    } else if (tok.text == static_cast<decltype(tok.text)>("for")) {
      get_next_token();

      // options: for a in arr; for a, b in obj
      if (tok.kind != Token::Kind::Id) {
        throw_parser_error("expected id, got '" + tok.describe() + "'");
      }

      Token value_token = tok;
      get_next_token();

      // Object type
      std::shared_ptr<ForStatementNode> for_statement_node;
      if (tok.kind == Token::Kind::Comma) {
        get_next_token();
        if (tok.kind != Token::Kind::Id) {
          throw_parser_error("expected id, got '" + tok.describe() + "'");
        }

        const Token key_token = std::move(value_token);
        value_token = tok;
        get_next_token();

        for_statement_node = std::make_shared<ForObjectStatementNode>(static_cast<std::string>(key_token.text), static_cast<std::string>(value_token.text),
                                                                      current_block, tok.text.data() - tmpl.content.c_str());

        // Array type
      } else {
        for_statement_node =
            std::make_shared<ForArrayStatementNode>(static_cast<std::string>(value_token.text), current_block, tok.text.data() - tmpl.content.c_str());
      }

      current_block->nodes.emplace_back(for_statement_node);
      for_statement_stack.emplace(for_statement_node.get());
      current_block = &for_statement_node->body;
      current_expression_list = &for_statement_node->condition;

      if (tok.kind != Token::Kind::Id || tok.text != static_cast<decltype(tok.text)>("in")) {
        throw_parser_error("expected 'in', got '" + tok.describe() + "'");
      }
      get_next_token();

      if (!parse_expression(tmpl, closing)) {
        return false;
      }
    } else if (tok.text == static_cast<decltype(tok.text)>("endfor")) {
      if (for_statement_stack.empty()) {
        throw_parser_error("endfor without matching for");
      }

      auto& for_statement_data = for_statement_stack.top();
      get_next_token();

      current_block = for_statement_data->parent;
      for_statement_stack.pop();
    } else if (tok.text == static_cast<decltype(tok.text)>("include")) {
      get_next_token();

      std::string template_name = parse_filename();
      add_to_template_storage(path, template_name);

      current_block->nodes.emplace_back(std::make_shared<IncludeStatementNode>(template_name, tok.text.data() - tmpl.content.c_str()));

      get_next_token();
    } else if (tok.text == static_cast<decltype(tok.text)>("extends")) {
      get_next_token();

      std::string template_name = parse_filename();
      add_to_template_storage(path, template_name);

      current_block->nodes.emplace_back(std::make_shared<ExtendsStatementNode>(template_name, tok.text.data() - tmpl.content.c_str()));

      get_next_token();
    } else if (tok.text == static_cast<decltype(tok.text)>("set")) {
      get_next_token();

      if (tok.kind != Token::Kind::Id) {
        throw_parser_error("expected variable name, got '" + tok.describe() + "'");
      }

      const std::string key = static_cast<std::string>(tok.text);
      get_next_token();

      auto set_statement_node = std::make_shared<SetStatementNode>(key, tok.text.data() - tmpl.content.c_str());
      current_block->nodes.emplace_back(set_statement_node);
      current_expression_list = &set_statement_node->expression;

      if (tok.text != static_cast<decltype(tok.text)>("=")) {
        throw_parser_error("expected '=', got '" + tok.describe() + "'");
      }
      get_next_token();

      if (!parse_expression(tmpl, closing)) {
        return false;
      }
    } else {
      return false;
    }
    return true;
  }